

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::runtime::cla::parser>::reset<boost::runtime::cla::parser>
          (shared_ptr<boost::runtime::cla::parser> *this,parser *p)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  shared_ptr<boost::runtime::cla::parser> local_18;
  
  if ((p != (parser *)0x0) && (this->px == p)) {
    __assert_fail("p == 0 || p != px",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                  ,0x2ba,
                  "void boost::shared_ptr<boost::runtime::cla::parser>::reset(Y *) [T = boost::runtime::cla::parser, Y = boost::runtime::cla::parser]"
                 );
  }
  shared_ptr<boost::runtime::cla::parser>(&local_18,p);
  peVar1 = this->px;
  psVar2 = (this->pn).pi_;
  this->px = local_18.px;
  (this->pn).pi_ = local_18.pn.pi_;
  local_18.px = peVar1;
  local_18.pn.pi_ = psVar2;
  detail::shared_count::~shared_count(&local_18.pn);
  return;
}

Assistant:

void reset( Y * p ) // Y must be complete
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type( p ).swap( *this );
    }